

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O3

void show_skill_cmds(CHAR_DATA *ch,int tar)

{
  char *astr;
  bool bVar1;
  size_t sVar2;
  long lVar3;
  char buf1 [9216];
  char buf [4608];
  uint local_3644;
  char local_3638 [9216];
  char local_1238 [4616];
  
  local_3638[0] = '\0';
  lVar3 = 0;
  local_3644 = 0;
  do {
    astr = *(char **)((long)skill_table[0].skill_level + lVar3 + -8);
    if (astr == (char *)0x0) break;
    bVar1 = str_cmp(astr,"reserved");
    if (((bVar1) && (*(code **)((long)skill_table[0].skill_level + lVar3 + 0x18) != spell_null)) &&
       ((tar == -1 || (*(short *)((long)skill_table[0].skill_level + lVar3 + 0x20) == tar)))) {
      sprintf(local_1238,"%-19.18s",*(undefined8 *)((long)skill_table[0].skill_level + lVar3 + -8));
      strcat(local_3638,local_1238);
      local_3644 = local_3644 + 1;
      if ((local_3644 & 3) == 0) {
        sVar2 = strlen(local_3638);
        (local_3638 + sVar2)[0] = '\n';
        (local_3638 + sVar2)[1] = '\r';
        local_3638[sVar2 + 2] = '\0';
      }
    }
    lVar3 = lVar3 + 0x60;
  } while (lVar3 != 0x12c00);
  if ((local_3644 & 3) != 0) {
    sVar2 = strlen(local_3638);
    (local_3638 + sVar2)[0] = '\n';
    (local_3638 + sVar2)[1] = '\r';
    local_3638[sVar2 + 2] = '\0';
  }
  send_to_char(local_3638,ch);
  return;
}

Assistant:

void show_skill_cmds(CHAR_DATA *ch, int tar)
{
	char buf[MAX_STRING_LENGTH];
	char buf1[MAX_STRING_LENGTH * 2];
	int sn;
	int col;

	buf1[0] = '\0';
	col = 0;

	for (sn = 0; sn < MAX_SKILL; sn++)
	{
		if (!skill_table[sn].name)
			break;

		if (!str_cmp(skill_table[sn].name, "reserved") || skill_table[sn].spell_fun == spell_null)
			continue;

		if (tar == -1 || skill_table[sn].target == tar)
		{
			sprintf(buf, "%-19.18s", skill_table[sn].name);
			strcat(buf1, buf);

			if (++col % 4 == 0)
				strcat(buf1, "\n\r");
		}
	}

	if (col % 4 != 0)
		strcat(buf1, "\n\r");

	send_to_char(buf1, ch);
}